

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O1

void __thiscall xray_re::se_stalker::se_stalker(se_stalker *this)

{
  cse_alife_trader_abstract::cse_alife_trader_abstract((cse_alife_trader_abstract *)this);
  cse_alife_monster_abstract::cse_alife_monster_abstract
            (&(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
              super_cse_alife_monster_abstract);
  (this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
  super_cse_alife_trader_abstract._vptr_cse_alife_trader_abstract =
       (_func_int **)&PTR_state_merge_002476a0;
  *(undefined ***)
   &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
    super_cse_alife_monster_abstract.super_cse_alife_creature_abstract =
       &PTR__cse_alife_human_abstract_002476f0;
  *(undefined ***)
   &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
    super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x118 =
       &PTR__cse_alife_human_abstract_00247758;
  (this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.m_equipment_preferences.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.m_equipment_preferences.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.m_equipment_preferences.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.m_main_weapon_preferences.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.m_main_weapon_preferences.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.m_main_weapon_preferences.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cse_ph_skeleton::cse_ph_skeleton(&(this->super_cse_alife_human_stalker).super_cse_ph_skeleton);
  (this->super_cse_alife_human_stalker).m_start_dialog._M_dataplus._M_p =
       (pointer)&(this->super_cse_alife_human_stalker).m_start_dialog.field_2;
  (this->super_cse_alife_human_stalker).m_start_dialog._M_string_length = 0;
  (this->super_cse_alife_human_stalker).m_start_dialog.field_2._M_local_buf[0] = '\0';
  (this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
  super_cse_alife_trader_abstract._vptr_cse_alife_trader_abstract =
       (_func_int **)&PTR_state_merge_0024c6f8;
  *(undefined ***)
   &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
    super_cse_alife_monster_abstract.super_cse_alife_creature_abstract = &PTR__se_stalker_0024c748;
  *(undefined ***)
   &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
    super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x118 =
       &PTR__se_stalker_0024c7b0;
  (this->super_cse_alife_human_stalker).super_cse_ph_skeleton._vptr_cse_ph_skeleton =
       (_func_int **)&PTR__se_stalker_0024c7d8;
  this->m_job_online = '\0';
  this->m_was_in_smart_terrain = false;
  this->m_death_dropped = false;
  (this->m_squad_id)._M_dataplus._M_p = (pointer)&(this->m_squad_id).field_2;
  (this->m_squad_id)._M_string_length = 0;
  (this->m_squad_id).field_2._M_local_buf[0] = '\0';
  this->m_sim_forced_online = false;
  (this->m_old_lvid)._M_dataplus._M_p = (pointer)&(this->m_old_lvid).field_2;
  (this->m_old_lvid)._M_string_length = 0;
  (this->m_old_lvid).field_2._M_local_buf[0] = '\0';
  (this->m_active_section)._M_dataplus._M_p = (pointer)&(this->m_active_section).field_2;
  (this->m_active_section)._M_string_length = 0;
  (this->m_active_section).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

se_stalker::se_stalker(): m_job_online(0), m_was_in_smart_terrain(false), m_death_dropped(false),
	m_sim_forced_online(false) {}